

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example.cc
# Opt level: O0

void VW::read_lines(vw *all,char *line,size_t param_3,v_array<example_*> *examples)

{
  example *peVar1;
  char *line_00;
  example **ppeVar2;
  v_array<example_*> *in_RCX;
  vw *in_RSI;
  vw *in_RDI;
  string *unaff_retaddr;
  char *in_stack_00000008;
  size_t i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  example *in_stack_ffffffffffffff38;
  vw *in_stack_ffffffffffffff40;
  v_array<example_*> *in_stack_ffffffffffffff50;
  example *ex;
  example *local_78;
  allocator local_59;
  string local_58 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  v_array<example_*> *local_20;
  vw *local_8;
  
  local_20 = in_RCX;
  local_8 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"\n",&local_59);
  split(in_stack_00000008,unaff_retaddr);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  local_78 = (example *)0x0;
  while( true ) {
    ex = local_78;
    peVar1 = (example *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size(&local_38);
    if (peVar1 <= ex) break;
    line_00 = (char *)v_array<example_*>::size(local_20);
    if (line_00 < (char *)((long)&(local_78->super_example_predict).indices._begin + 1U)) {
      in_stack_ffffffffffffff50 = local_20;
      get_unused_example(in_stack_ffffffffffffff40);
      v_array<example_*>::push_back
                ((v_array<example_*> *)in_stack_ffffffffffffff40,
                 (example **)in_stack_ffffffffffffff38);
    }
    in_stack_ffffffffffffff40 = local_8;
    ppeVar2 = v_array<example_*>::operator[](local_20,(size_t)local_78);
    in_stack_ffffffffffffff38 = *ppeVar2;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&local_38,(size_type)local_78);
    std::__cxx11::string::c_str();
    read_line(in_RSI,ex,line_00);
    local_78 = (example *)((long)&(local_78->super_example_predict).indices._begin + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffff50);
  return;
}

Assistant:

void read_lines(vw* all, char* line, size_t /*len*/, v_array<example*>& examples)
{
  auto lines = split(line, "\n");
  for (size_t i = 0; i < lines.size(); i++)
  {
    // Check if a new empty example needs to be added.
    if (examples.size() < i + 1)
    {
      examples.push_back(&VW::get_unused_example(all));
    }
    read_line(*all, examples[i], const_cast<char*>(lines[i].c_str()));
  }
}